

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O1

void __thiscall
QBlitterPaintEngine::drawPixmap(QBlitterPaintEngine *this,QRectF *r,QPixmap *pm,QRectF *sr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QBlitterPaintEnginePrivate *this_00;
  QPaintEngineState *pQVar3;
  undefined4 uVar4;
  QRasterBuffer *this_01;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  QBlittable *pQVar10;
  const_iterator pQVar11;
  const_iterator pQVar12;
  QPaintDevice *pQVar13;
  undefined4 extraout_var;
  QPaintEngineState *pQVar14;
  QRect *rect;
  QClipData *pQVar15;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  qreal local_68;
  qreal qStack_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBlitterPaintEnginePrivate *)
            (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.d_ptr.d;
  bVar6 = CapabilitiesToStateMask::canBlitterDrawPixmapOpacity(&this_00->caps,pm);
  if ((!bVar6) &&
     (bVar7 = CapabilitiesToStateMask::canBlitterDrawPixmap(&this_00->caps,r,pm,sr), !bVar7)) {
    pQVar10 = QBlittablePlatformPixmap::blittable(this_00->pmData);
    bVar6 = QBlittable::isLocked(pQVar10);
    if (!bVar6) {
      this_01 = (this_00->super_QRasterPaintEnginePrivate).rasterBuffer.d;
      iVar8 = (*(this_00->pmData->super_QPlatformPixmap)._vptr_QPlatformPixmap[0x16])();
      QRasterBuffer::prepare(this_01,(QImage *)CONCAT44(extraout_var,iVar8));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QRasterPaintEngine::drawPixmap(&this->super_QRasterPaintEngine,r,pm,sr);
      return;
    }
    goto LAB_003ba7fd;
  }
  pQVar10 = QBlittablePlatformPixmap::blittable(this_00->pmData);
  QBlittable::unlock(pQVar10);
  local_58.xp = r->xp;
  local_58.yp = r->yp;
  local_58.w = r->w;
  local_58.h = r->h;
  if (this_00->hasXForm != 0) {
    pQVar3 = (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.state;
    pQVar14 = pQVar3 + -2;
    if (pQVar3 == (QPaintEngineState *)0x0) {
      pQVar14 = (QPaintEngineState *)0x0;
    }
    QTransform::mapRect(&local_58,(QTransform *)(pQVar14 + 0x36),r);
  }
  pQVar14 = ((this_00->super_QRasterPaintEnginePrivate).super_QPaintEngineExPrivate.
             super_QPaintEnginePrivate.q_ptr)->state;
  if (((pQVar14 == (QPaintEngineState *)0x0) ||
      (pQVar15 = *(QClipData **)(pQVar14 + 0x100), pQVar15 == (QClipData *)0x0)) ||
     ((pQVar15->field_0x48 & 1) == 0)) {
    pQVar15 = (this_00->super_QRasterPaintEnginePrivate).baseClip.d;
  }
  if (pQVar15 == (QClipData *)0x0) {
    local_68 = -NAN;
    qStack_60 = -NAN;
    local_78._8_4_ = 0xffffffff;
    local_78._0_8_ = 0xffffffffffffffff;
    local_78._12_4_ = 0xffffffff;
    pQVar13 = QPaintEngine::paintDevice((QPaintEngine *)this);
    iVar8 = (*pQVar13->_vptr_QPaintDevice[4])(pQVar13,1);
    pQVar13 = QPaintEngine::paintDevice((QPaintEngine *)this);
    iVar9 = (*pQVar13->_vptr_QPaintDevice[4])(pQVar13,2);
    qStack_60 = (qreal)iVar9;
    local_78 = ZEXT816(0);
    local_68 = (double)iVar8;
LAB_003ba7d2:
    QBlitterPaintEnginePrivate::clipAndDrawPixmap(this_00,(QRectF *)local_78,&local_58,pm,sr,bVar6);
  }
  else {
    if ((pQVar15->field_0x48 & 2) != 0) {
      uVar2 = (pQVar15->clipRect).x1;
      uVar5 = (pQVar15->clipRect).y1;
      local_78._8_4_ = SUB84((double)(int)uVar5,0);
      local_78._0_8_ = (double)(int)uVar2;
      local_78._12_4_ = (int)((ulong)(double)(int)uVar5 >> 0x20);
      qStack_60 = (qreal)(((long)(pQVar15->clipRect).y2.m_i - (long)(int)uVar5) + 1);
      local_68 = (double)(((long)(pQVar15->clipRect).x2.m_i - (long)(int)uVar2) + 1);
      goto LAB_003ba7d2;
    }
    if ((pQVar15->field_0x48 & 4) != 0) {
      pQVar11 = QRegion::begin(&pQVar15->clipRegion);
      pQVar12 = QRegion::end(&pQVar15->clipRegion);
      for (; pQVar11 != pQVar12; pQVar11 = pQVar11 + 1) {
        uVar1 = pQVar11->x1;
        uVar4 = pQVar11->y1;
        local_78._8_4_ = SUB84((double)(int)uVar4,0);
        local_78._0_8_ = (double)(int)uVar1;
        local_78._12_4_ = (int)((ulong)(double)(int)uVar4 >> 0x20);
        local_68 = (qreal)(((long)(pQVar11->x2).m_i - (long)(int)uVar1) + 1);
        qStack_60 = (qreal)(((long)(pQVar11->y2).m_i - (long)(int)uVar4) + 1);
        QBlitterPaintEnginePrivate::clipAndDrawPixmap
                  (this_00,(QRectF *)local_78,&local_58,pm,sr,bVar6);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003ba7fd:
  __stack_chk_fail();
}

Assistant:

void QBlitterPaintEngine::drawPixmap(const QRectF &r, const QPixmap &pm, const QRectF &sr)
{
    Q_D(QBlitterPaintEngine);
    bool canDrawOpacity;

    canDrawOpacity = d->caps.canBlitterDrawPixmapOpacity(pm);
    if (canDrawOpacity || (d->caps.canBlitterDrawPixmap(r, pm, sr))) {

        d->unlock();
        QRectF targetRect = r;
        if (d->hasXForm)
            targetRect = state()->matrix.mapRect(r);
        const QClipData *clipData = d->clip();
        if (clipData) {
            if (clipData->hasRectClip) {
                d->clipAndDrawPixmap(clipData->clipRect, targetRect, pm, sr, canDrawOpacity);
            } else if (clipData->hasRegionClip) {
                for (const QRect &rect : clipData->clipRegion)
                    d->clipAndDrawPixmap(rect, targetRect, pm, sr, canDrawOpacity);
            }
        } else {
            QRectF deviceRect(0, 0, paintDevice()->width(), paintDevice()->height());
            d->clipAndDrawPixmap(deviceRect, targetRect, pm, sr, canDrawOpacity);
        }
    }else {
        d->lock();
        d->pmData->markRasterOverlay(r);
        QRasterPaintEngine::drawPixmap(r, pm, sr);
    }
}